

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,long,long,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalAddOverflowCheck,bool,true,false>
               (long *ldata,long *rdata,long *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  OutOfRangeException *pOVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  string local_58;
  unsigned_long *local_38;
  
  local_38 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (local_38 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar2 = *ldata;
      iVar9 = 0;
      do {
        lVar3 = rdata[iVar9];
        if (lVar3 < 0) {
          lVar5 = -999999999999999999 - lVar3;
          if (lVar2 < lVar5) goto LAB_0107f5ec;
LAB_0107f5fc:
          lVar5 = lVar3 + lVar2;
          bVar4 = true;
        }
        else {
          lVar5 = 999999999999999999 - lVar3;
          if (lVar2 <= lVar5) goto LAB_0107f5fc;
LAB_0107f5ec:
          bVar4 = false;
        }
        if (!bVar4) {
          pOVar7 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,
                     "Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an explicit cast to a bigger decimal."
                     ,"");
          OutOfRangeException::OutOfRangeException<long,long>(pOVar7,&local_58,lVar2,lVar3);
          __cxa_throw(pOVar7,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        result_data[iVar9] = lVar5;
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar8 = 0;
    uVar10 = 0;
    do {
      uVar1 = local_38[uVar8];
      uVar11 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar11 = count;
      }
      uVar6 = uVar11;
      if (uVar1 != 0) {
        uVar6 = uVar10;
        if (uVar1 == 0xffffffffffffffff) {
          if (uVar10 < uVar11) {
            lVar2 = *ldata;
            do {
              lVar3 = rdata[uVar10];
              if (lVar3 < 0) {
                lVar5 = -999999999999999999 - lVar3;
                if (lVar2 < lVar5) goto LAB_0107f4e8;
LAB_0107f4f8:
                lVar5 = lVar3 + lVar2;
                bVar4 = true;
              }
              else {
                lVar5 = 999999999999999999 - lVar3;
                if (lVar2 <= lVar5) goto LAB_0107f4f8;
LAB_0107f4e8:
                bVar4 = false;
              }
              if (!bVar4) {
                pOVar7 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_58,
                           "Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an explicit cast to a bigger decimal."
                           ,"");
                OutOfRangeException::OutOfRangeException<long,long>(pOVar7,&local_58,lVar2,lVar3);
                __cxa_throw(pOVar7,&OutOfRangeException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              result_data[uVar10] = lVar5;
              uVar10 = uVar10 + 1;
              uVar6 = uVar10;
            } while (uVar11 != uVar10);
          }
        }
        else if (uVar10 < uVar11) {
          uVar6 = 0;
          do {
            if ((uVar1 >> (uVar6 & 0x3f) & 1) != 0) {
              lVar2 = *ldata;
              lVar3 = rdata[uVar10 + uVar6];
              if (lVar3 < 0) {
                lVar5 = -999999999999999999 - lVar3;
                if (lVar2 < lVar5) goto LAB_0107f558;
LAB_0107f568:
                lVar5 = lVar3 + lVar2;
                bVar4 = true;
              }
              else {
                lVar5 = 999999999999999999 - lVar3;
                if (lVar2 <= lVar5) goto LAB_0107f568;
LAB_0107f558:
                bVar4 = false;
              }
              if (!bVar4) {
                pOVar7 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_58,
                           "Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an explicit cast to a bigger decimal."
                           ,"");
                OutOfRangeException::OutOfRangeException<long,long>(pOVar7,&local_58,lVar2,lVar3);
                __cxa_throw(pOVar7,&OutOfRangeException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              result_data[uVar10 + uVar6] = lVar5;
            }
            uVar6 = uVar6 + 1;
          } while ((uVar10 - uVar11) + uVar6 != 0);
          uVar6 = uVar10 + uVar6;
        }
      }
      uVar8 = uVar8 + 1;
      uVar10 = uVar6;
    } while (uVar8 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}